

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
Alice::ExtractPermutationShare
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,Alice *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *V,int rows,int cols)

{
  pointer *pppVar1;
  pointer ppVar2;
  long lVar3;
  iterator __position;
  ulong uVar4;
  pointer ppVar5;
  int iVar6;
  pair<long,_long> local_48;
  
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (__return_storage_ptr__,(long)rows,(allocator_type *)&local_48);
  local_48.first._0_4_ = 0xffffffff;
  local_48.first._4_4_ = 0xffffffff;
  local_48.second._0_4_ = 0xffffffff;
  local_48.second._4_4_ = 0xffffffff;
  if (0 < rows) {
    ppVar2 = (__return_storage_ptr__->
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      if (0 < cols) {
        lVar3 = *(long *)&(V->
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar4].
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data;
        ppVar5 = ppVar2 + uVar4;
        iVar6 = cols;
        do {
          ppVar5->first = *(long *)(lVar3 + -8 + (long)cols * 8);
          ppVar5->second = uVar4;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)rows);
  }
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
    _M_realloc_insert<std::pair<long,long>const&>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
               __return_storage_ptr__,__position,&local_48);
  }
  else {
    (__position._M_current)->first = -1;
    (__position._M_current)->second = -1;
    pppVar1 = &(__return_storage_ptr__->
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<long,long>>Alice::ExtractPermutationShare(std::vector<std::vector<long>>V, int rows, int cols)
{
    std::vector<std::pair<long,long>> Perm(rows);
    std::pair<long, long> last(-1,-1);
    for(int i = 0; i < rows; i++)
    {
        for(int j = 0; j < cols; j++)
        {
            Perm[i].first = V[i][cols-1];   //old address
            Perm[i].second = i;             //permuted address   
        }
    }
    Perm.push_back(last);
    return Perm;
}